

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

int __thiscall create::Create::init(Create *this,EVP_PKEY_CTX *ctx)

{
  ProtocolVersion PVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  Data *this_00;
  shared_ptr<create::Data> local_c8;
  shared_ptr<create::Data> local_b8;
  shared_ptr<create::Data> local_a8;
  value_type local_94;
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  local_90;
  allocator<float> local_65;
  value_type local_64;
  vector<float,_std::allocator<float>_> local_60;
  allocator<float> local_35;
  value_type local_34;
  vector<float,_std::allocator<float>_> local_30;
  byte local_11;
  Create *pCStack_10;
  bool install_signal_handler_local;
  Create *this_local;
  
  local_11 = (byte)ctx & 1;
  this->mainMotorPower = '\0';
  this->sideMotorPower = '\0';
  this->vacuumMotorPower = '\0';
  this->debrisLED = '\0';
  this->spotLED = '\0';
  this->dockLED = '\0';
  this->checkLED = '\0';
  this->powerLED = '\0';
  this->powerLEDIntensity = '\0';
  this->prevTicksLeft = 0;
  this->prevTicksRight = 0;
  this->totalLeftDist = 0.0;
  this->totalRightDist = 0.0;
  this->firstOnData = true;
  this->mode = MODE_OFF;
  (this->pose).x = 0.0;
  (this->pose).y = 0.0;
  (this->pose).yaw = 0.0;
  local_34 = 0.0;
  pCStack_10 = this;
  std::allocator<float>::allocator(&local_35);
  std::vector<float,_std::allocator<float>_>::vector(&local_30,9,&local_34,&local_35);
  std::vector<float,_std::allocator<float>_>::operator=(&(this->pose).covariance,&local_30);
  std::vector<float,_std::allocator<float>_>::~vector(&local_30);
  std::allocator<float>::~allocator(&local_35);
  (this->vel).x = 0.0;
  (this->vel).y = 0.0;
  (this->vel).yaw = 0.0;
  local_64 = 0.0;
  std::allocator<float>::allocator(&local_65);
  std::vector<float,_std::allocator<float>_>::vector(&local_60,9,&local_64,&local_65);
  std::vector<float,_std::allocator<float>_>::operator=(&(this->vel).covariance,&local_60);
  std::vector<float,_std::allocator<float>_>::~vector(&local_60);
  std::allocator<float>::~allocator(&local_65);
  local_94 = 0.0;
  boost::numeric::ublas::
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  ::matrix(&local_90,3,3,&local_94);
  boost::numeric::ublas::
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  ::operator=(&this->poseCovar,&local_90);
  boost::numeric::ublas::
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  ::~matrix(&local_90);
  this->requestedLeftVel = 0.0;
  this->requestedRightVel = 0.0;
  this->dtHistoryLength = 'd';
  this->modeReportWorkaround = false;
  this_00 = (Data *)operator_new(0x50);
  PVar1 = RobotModel::getVersion(&this->model);
  Data::Data(this_00,PVar1);
  std::shared_ptr<create::Data>::shared_ptr<create::Data,void>(&local_a8,this_00);
  std::shared_ptr<create::Data>::operator=(&this->data,&local_a8);
  std::shared_ptr<create::Data>::~shared_ptr(&local_a8);
  PVar1 = RobotModel::getVersion(&this->model);
  if (PVar1 == V_1) {
    std::make_shared<create::SerialQuery,std::shared_ptr<create::Data>&,bool&>
              (&local_b8,(bool *)&this->data);
    std::shared_ptr<create::Serial>::operator=
              (&this->serial,(shared_ptr<create::SerialQuery> *)&local_b8);
    std::shared_ptr<create::SerialQuery>::~shared_ptr((shared_ptr<create::SerialQuery> *)&local_b8);
    iVar2 = extraout_EAX;
  }
  else {
    std::make_shared<create::SerialStream,std::shared_ptr<create::Data>&,unsigned_char_const&,bool&>
              (&local_c8,(uchar *)&this->data,(bool *)&util::STREAM_HEADER);
    std::shared_ptr<create::Serial>::operator=
              (&this->serial,(shared_ptr<create::SerialStream> *)&local_c8);
    std::shared_ptr<create::SerialStream>::~shared_ptr
              ((shared_ptr<create::SerialStream> *)&local_c8);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void Create::init(bool install_signal_handler) {
    mainMotorPower = 0;
    sideMotorPower = 0;
    vacuumMotorPower = 0;
    debrisLED = 0;
    spotLED = 0;
    dockLED = 0;
    checkLED = 0;
    powerLED = 0;
    powerLEDIntensity = 0;
    prevTicksLeft = 0;
    prevTicksRight = 0;
    totalLeftDist = 0.0;
    totalRightDist = 0.0;
    firstOnData = true;
    mode = MODE_OFF;
    pose.x = 0;
    pose.y = 0;
    pose.yaw = 0;
    pose.covariance = std::vector<float>(9, 0.0);
    vel.x = 0;
    vel.y = 0;
    vel.yaw = 0;
    vel.covariance = std::vector<float>(9, 0.0);
    poseCovar = Matrix(3, 3, 0.0);
    requestedLeftVel = 0;
    requestedRightVel = 0;
    dtHistoryLength = 100;
    modeReportWorkaround = false;
    data = std::shared_ptr<Data>(new Data(model.getVersion()));
    if (model.getVersion() == V_1) {
      serial = std::make_shared<SerialQuery>(data, install_signal_handler);
    } else {
      serial = std::make_shared<SerialStream>(
        data, create::util::STREAM_HEADER, install_signal_handler);
    }
  }